

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O1

void __thiscall
helics::CommonCore::addSourceTarget
          (CommonCore *this,InterfaceHandle handle,string_view targetName,InterfaceType hint)

{
  byte bVar1;
  undefined8 *puVar2;
  _Hash_node_base *p_Var3;
  _Hash_node<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>,_true>
  *p_Var4;
  InvalidIdentifier *this_00;
  HelicsException *this_01;
  char *pcVar5;
  size_t sVar6;
  action_t newAction;
  string_view string1;
  string_view message;
  string_view message_00;
  string_view string2;
  undefined1 local_e8 [16];
  undefined8 local_d8;
  undefined8 local_d0;
  Time TStack_c8;
  Time local_c0;
  Time TStack_b8;
  Time local_b0;
  SmallBuffer SStack_a8;
  pointer pbStack_48;
  pointer local_40;
  pointer pbStack_38;
  
  sVar6 = targetName._M_len;
  p_Var4 = getHandleInfo(this,handle);
  if (p_Var4 == (_Hash_node<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>,_true>
                 *)0x0) {
    this_00 = (InvalidIdentifier *)__cxa_allocate_exception(0x28);
    pcVar5 = "invalid handle";
    sVar6 = 0xe;
LAB_002a7a1c:
    message._M_str = pcVar5;
    message._M_len = sVar6;
    InvalidIdentifier::InvalidIdentifier(this_00,message);
    __cxa_throw(this_00,&InvalidIdentifier::typeinfo,HelicsException::~HelicsException);
  }
  if (((p_Var4->
       super__Hash_node_value<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>,_true>
       ).
       super__Hash_node_value_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>
       ._M_storage._M_storage.__data[7] & 0x20) != 0) {
    this_00 = (InvalidIdentifier *)__cxa_allocate_exception(0x28);
    pcVar5 = "Interface is receive only and cannot have destination targets";
    sVar6 = 0x3d;
    goto LAB_002a7a1c;
  }
  SStack_a8.heap = local_e8 + 0x40;
  local_e8._0_4_ = cmd_ignore;
  local_e8._4_4_ = 0;
  local_d8._0_4_ = 0;
  local_d8._4_4_ = -1700000000;
  TStack_c8.internalTimeCode = 0;
  local_c0.internalTimeCode = 0;
  TStack_b8.internalTimeCode = 0;
  local_b0.internalTimeCode = 0;
  SStack_a8.buffer._M_elems[0] = 0;
  SStack_a8.buffer._M_elems[1] = 0;
  SStack_a8.buffer._M_elems[2] = 0;
  SStack_a8.buffer._M_elems[3] = 0;
  SStack_a8.buffer._M_elems[4] = 0;
  SStack_a8.buffer._M_elems[5] = 0;
  SStack_a8.buffer._M_elems[6] = 0;
  SStack_a8.buffer._M_elems[7] = 0;
  SStack_a8.buffer._M_elems[8] = 0;
  SStack_a8.buffer._M_elems[9] = 0;
  SStack_a8.buffer._M_elems[10] = 0;
  SStack_a8.buffer._M_elems[0xb] = 0;
  SStack_a8.buffer._M_elems[0xc] = 0;
  SStack_a8.buffer._M_elems[0xd] = 0;
  SStack_a8.buffer._M_elems[0xe] = 0;
  SStack_a8.buffer._M_elems[0xf] = 0;
  SStack_a8.buffer._M_elems[0x10] = 0;
  SStack_a8.buffer._M_elems[0x11] = 0;
  SStack_a8.buffer._M_elems[0x12] = 0;
  SStack_a8.buffer._M_elems[0x13] = 0;
  SStack_a8.buffer._M_elems[0x14] = 0;
  SStack_a8.buffer._M_elems[0x15] = 0;
  SStack_a8.buffer._M_elems[0x16] = 0;
  SStack_a8.buffer._M_elems[0x17] = 0;
  SStack_a8.buffer._M_elems[0x18] = 0;
  SStack_a8.buffer._M_elems[0x19] = 0;
  SStack_a8.buffer._M_elems[0x1a] = 0;
  SStack_a8.buffer._M_elems[0x1b] = 0;
  SStack_a8.buffer._M_elems[0x1c] = 0;
  SStack_a8.buffer._M_elems[0x1d] = 0;
  SStack_a8.buffer._M_elems[0x1e] = 0;
  SStack_a8.buffer._M_elems[0x1f] = 0;
  SStack_a8.buffer._M_elems[0x20] = 0;
  SStack_a8.buffer._M_elems[0x21] = 0;
  SStack_a8.buffer._M_elems[0x22] = 0;
  SStack_a8.buffer._M_elems[0x23] = 0;
  SStack_a8.buffer._M_elems[0x24] = 0;
  SStack_a8.buffer._M_elems[0x25] = 0;
  SStack_a8.buffer._M_elems[0x26] = 0;
  SStack_a8.buffer._M_elems[0x27] = 0;
  SStack_a8.buffer._M_elems[0x28] = 0;
  SStack_a8.buffer._M_elems[0x29] = 0;
  SStack_a8.buffer._M_elems[0x2a] = 0;
  SStack_a8.buffer._M_elems[0x2b] = 0;
  SStack_a8.buffer._M_elems[0x2c] = 0;
  SStack_a8.buffer._M_elems[0x2d] = 0;
  SStack_a8.buffer._M_elems[0x2e] = 0;
  SStack_a8.buffer._M_elems[0x2f] = 0;
  SStack_a8.buffer._M_elems[0x30] = 0;
  SStack_a8.buffer._M_elems[0x31] = 0;
  SStack_a8.buffer._M_elems[0x32] = 0;
  SStack_a8.buffer._M_elems[0x33] = 0;
  SStack_a8.buffer._M_elems[0x34] = 0;
  SStack_a8.buffer._M_elems[0x35] = 0;
  SStack_a8.buffer._M_elems[0x36] = 0;
  SStack_a8.buffer._M_elems[0x37] = 0;
  SStack_a8.buffer._M_elems[0x38] = 0;
  SStack_a8.buffer._M_elems[0x39] = 0;
  SStack_a8.buffer._M_elems[0x3a] = 0;
  SStack_a8.buffer._M_elems[0x3b] = 0;
  SStack_a8.buffer._M_elems[0x3c] = 0;
  SStack_a8.buffer._M_elems[0x3d] = 0;
  SStack_a8.buffer._M_elems[0x3e] = 0;
  SStack_a8.buffer._M_elems[0x3f] = 0;
  SStack_a8.bufferSize = 0;
  SStack_a8.bufferCapacity = 0x40;
  SStack_a8.nonOwning = false;
  SStack_a8.locked = false;
  SStack_a8.usingAllocatedBuffer = false;
  SStack_a8.errorCondition = '\0';
  SStack_a8.userKey = 0;
  pbStack_48 = (pointer)0x0;
  local_40 = (pointer)0x0;
  pbStack_38 = (pointer)0x0;
  local_e8._8_8_ = (p_Var4->super__Hash_node_base)._M_nxt;
  local_d0 = (ulong)CONCAT22(*(undefined2 *)
                              ((long)&(p_Var4->
                                      super__Hash_node_value<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>,_true>
                                      ).
                                      super__Hash_node_value_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>
                                      ._M_storage._M_storage + 6),
                             (short)(char)(p_Var4->
                                          super__Hash_node_value<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>,_true>
                                          ).
                                          super__Hash_node_value_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>
                                          ._M_storage._M_storage.__data[4]);
  if (((SmallBuffer *)SStack_a8.heap != (SmallBuffer *)targetName._M_str) &&
     (SmallBuffer::reserve((SmallBuffer *)SStack_a8.heap,sVar6), sVar6 != 0)) {
    SStack_a8.bufferSize = sVar6;
    memcpy(SStack_a8.heap,(SmallBuffer *)targetName._M_str,sVar6);
    sVar6 = SStack_a8.bufferSize;
  }
  SStack_a8.bufferSize = sVar6;
  bVar1 = (p_Var4->
          super__Hash_node_value<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>,_true>
          ).
          super__Hash_node_value_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>
          ._M_storage._M_storage.__data[4];
  if (bVar1 < 0x69) {
    if (bVar1 != 0x65) {
      if (bVar1 == 0x66) {
        ActionMessage::setAction((ActionMessage *)local_e8,cmd_add_named_endpoint);
        if (*(long *)((long)&(p_Var4->
                             super__Hash_node_value<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>,_true>
                             ).
                             super__Hash_node_value_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>
                             ._M_storage._M_storage + 0x10) == 0) {
          puVar2 = (undefined8 *)
                   p_Var4[2].
                   super__Hash_node_value<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>,_true>
                   .super__Hash_node_code_cache<true>._M_hash_code;
          sVar6 = puVar2[1];
          if ((sVar6 != 0) ||
             (p_Var4[3].super__Hash_node_base._M_nxt[1]._M_nxt != (_Hash_node_base *)0x0)) {
            p_Var3 = p_Var4[3].super__Hash_node_base._M_nxt;
            string1._M_str = (char *)*puVar2;
            string1._M_len = sVar6;
            string2._M_str = (char *)p_Var3->_M_nxt;
            string2._M_len = (size_t)p_Var3[1]._M_nxt;
            ActionMessage::setStringData((ActionMessage *)local_e8,string1,string2);
          }
        }
        if (((p_Var4->
             super__Hash_node_value<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>,_true>
             ).
             super__Hash_node_value_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>
             ._M_storage._M_storage.__data[7] & 2) != 0) {
          local_d0 = local_d0 | 0x2000000;
        }
        goto LAB_002a798a;
      }
LAB_002a7a3a:
      this_01 = (HelicsException *)__cxa_allocate_exception(0x28);
      pcVar5 = "publications cannot have source targets";
      sVar6 = 0x27;
LAB_002a7a53:
      message_00._M_str = pcVar5;
      message_00._M_len = sVar6;
      HelicsException::HelicsException(this_01,message_00);
      *(undefined ***)this_01 = &PTR__HelicsException_004cbf60;
      __cxa_throw(this_01,&InvalidIdentifier::typeinfo,HelicsException::~HelicsException);
    }
LAB_002a7965:
    newAction = cmd_add_named_filter;
    if (hint != FILTER) {
      newAction = (uint)(hint == PUBLICATION) ^ cmd_add_named_endpoint;
    }
  }
  else {
    newAction = cmd_add_named_publication;
    if (bVar1 == 0x69) goto LAB_002a797f;
    if (bVar1 == 0x73) goto LAB_002a7965;
    if (bVar1 != 0x74) goto LAB_002a7a3a;
    if ((char)hint < 'i') {
      if (hint == ENDPOINT) {
        newAction = cmd_add_named_endpoint;
      }
      else {
        if (hint != FILTER) goto LAB_002a79bf;
        newAction = cmd_add_named_filter;
      }
    }
    else if (hint != PUBLICATION) {
      if (hint == INPUT) {
        this_01 = (HelicsException *)__cxa_allocate_exception(0x28);
        pcVar5 = "translators cannot have inputs as a source";
        sVar6 = 0x2a;
        goto LAB_002a7a53;
      }
LAB_002a79bf:
      ActionMessage::setAction((ActionMessage *)local_e8,cmd_add_named_publication);
      BrokerBase::addActionMessage(&this->super_BrokerBase,(ActionMessage *)local_e8);
      newAction = cmd_add_named_endpoint;
    }
  }
LAB_002a797f:
  ActionMessage::setAction((ActionMessage *)local_e8,newAction);
LAB_002a798a:
  BrokerBase::addActionMessage(&this->super_BrokerBase,(ActionMessage *)local_e8);
  ActionMessage::~ActionMessage((ActionMessage *)local_e8);
  return;
}

Assistant:

void CommonCore::addSourceTarget(InterfaceHandle handle,
                                 std::string_view targetName,
                                 InterfaceType hint)
{
    const auto* handleInfo = getHandleInfo(handle);
    if (handleInfo == nullptr) {
        throw(InvalidIdentifier("invalid handle"));
    }
    if (checkActionFlag(*handleInfo, source_only_flag)) {
        throw(InvalidIdentifier("Interface is receive only and cannot have destination targets"));
    }
    ActionMessage cmd;
    cmd.setSource(handleInfo->handle);
    cmd.counter = static_cast<uint16_t>(handleInfo->handleType);
    cmd.flags = handleInfo->flags;
    cmd.payload = targetName;
    switch (handleInfo->handleType) {
        case InterfaceType::ENDPOINT:
        case InterfaceType::SINK:
            if (hint == InterfaceType::FILTER) {
                cmd.setAction(CMD_ADD_NAMED_FILTER);
            } else if (hint == InterfaceType::PUBLICATION) {
                cmd.setAction(CMD_ADD_NAMED_PUBLICATION);
            } else {
                cmd.setAction(CMD_ADD_NAMED_ENDPOINT);
            }
            break;

        case InterfaceType::TRANSLATOR:
            switch (hint) {
                case InterfaceType::PUBLICATION:
                    cmd.setAction(CMD_ADD_NAMED_PUBLICATION);
                    break;

                case InterfaceType::INPUT:
                    throw(InvalidIdentifier("translators cannot have inputs as a source"));
                    break;
                case InterfaceType::ENDPOINT:
                    cmd.setAction(CMD_ADD_NAMED_ENDPOINT);
                    break;
                case InterfaceType::FILTER:
                    cmd.setAction(CMD_ADD_NAMED_FILTER);
                    break;
                default:
                    // translators can have two inputs
                    cmd.setAction(CMD_ADD_NAMED_PUBLICATION);
                    addActionMessage(cmd);
                    cmd.setAction(CMD_ADD_NAMED_ENDPOINT);
                    break;
            }
            break;
        case InterfaceType::FILTER:
            cmd.setAction(CMD_ADD_NAMED_ENDPOINT);
            if (handleInfo->key.empty()) {
                if ((!handleInfo->type_in.empty()) || (!handleInfo->type_out.empty())) {
                    cmd.setStringData(handleInfo->type_in, handleInfo->type_out);
                }
            }
            if (checkActionFlag(*handleInfo, clone_flag)) {
                setActionFlag(cmd, clone_flag);
            }
            break;
        case InterfaceType::INPUT:
            cmd.setAction(CMD_ADD_NAMED_PUBLICATION);
            break;
        case InterfaceType::PUBLICATION:
        default:
            throw(InvalidIdentifier("publications cannot have source targets"));
    }
    addActionMessage(std::move(cmd));
}